

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O0

int kvtree_util_get_double(kvtree *hash,char *key,double *val)

{
  int iVar1;
  double local_38;
  double val_tmp;
  char *val_str;
  double *pdStack_20;
  int rc;
  double *val_local;
  char *key_local;
  kvtree *hash_local;
  
  val_str._4_4_ = 1;
  pdStack_20 = val;
  val_local = (double *)key;
  key_local = (char *)hash;
  val_tmp = (double)kvtree_get_val(hash,key);
  if (((char *)val_tmp != (char *)0x0) &&
     (iVar1 = kvtree_atod((char *)val_tmp,&local_38), iVar1 == 0)) {
    *pdStack_20 = local_38;
    val_str._4_4_ = 0;
  }
  return val_str._4_4_;
}

Assistant:

int kvtree_util_get_double(const kvtree* hash, const char* key, double* val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    double val_tmp;
    if (kvtree_atod(val_str, &val_tmp) == KVTREE_SUCCESS) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}